

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertyReadCellIsThreeState(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  int iVar1;
  Scl_Item_t *local_30;
  Scl_Item_t *pItem;
  Scl_Item_t *pPin;
  Scl_Item_t *pCell_local;
  Scl_Tree_t *p_local;
  
  pItem = Scl_LibertyItem(p,pCell->Child);
  do {
    if (pItem == (Scl_Item_t *)0x0) {
      return 0;
    }
    iVar1 = Scl_LibertyCompare(p,pItem->Key,"pin");
    if (iVar1 == 0) {
      for (local_30 = Scl_LibertyItem(p,pItem->Child); local_30 != (Scl_Item_t *)0x0;
          local_30 = Scl_LibertyItem(p,local_30->Next)) {
        iVar1 = Scl_LibertyCompare(p,local_30->Key,"three_state");
        if (iVar1 == 0) {
          return 1;
        }
      }
    }
    pItem = Scl_LibertyItem(p,pItem->Next);
  } while( true );
}

Assistant:

int Scl_LibertyReadCellIsThreeState( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pPin, * pItem;
    Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        Scl_ItemForEachChildName( p, pPin, pItem, "three_state" )
            return 1;
    return 0;
}